

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::ParameterizedTestSuiteInfo<FilmGrainEncodeTest>::TestInfo::TestInfo
          (TestInfo *this,char *a_test_suite_base_name,char *a_test_base_name,
          TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_int,_int,_libaom_test::TestMode>_>
          *a_test_meta_factory,CodeLocation *a_code_location)

{
  CodeLocation *this_00;
  char *in_RDX;
  char *in_RSI;
  string *in_RDI;
  CodeLocation *__p;
  allocator local_3d [20];
  allocator local_29 [17];
  char *local_18;
  
  local_18 = in_RDX;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(in_RDI,in_RSI,local_29);
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  this_00 = (CodeLocation *)(in_RDI + 0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this_00,local_18,local_3d);
  std::allocator<char>::~allocator((allocator<char> *)local_3d);
  __p = (CodeLocation *)(in_RDI + 0x40);
  std::
  unique_ptr<testing::internal::TestMetaFactoryBase<std::tuple<libaom_test::CodecFactory_const*,int,int,libaom_test::TestMode>>,std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<libaom_test::CodecFactory_const*,int,int,libaom_test::TestMode>>>>
  ::
  unique_ptr<std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<libaom_test::CodecFactory_const*,int,int,libaom_test::TestMode>>>,void>
            ((unique_ptr<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_int,_int,_libaom_test::TestMode>_>,_std::default_delete<testing::internal::TestMetaFactoryBase<std::tuple<const_libaom_test::CodecFactory_*,_int,_int,_libaom_test::TestMode>_>_>_>
              *)this_00,(pointer)__p);
  CodeLocation::CodeLocation(this_00,__p);
  return;
}

Assistant:

TestInfo(const char* a_test_suite_base_name, const char* a_test_base_name,
             TestMetaFactoryBase<ParamType>* a_test_meta_factory,
             CodeLocation a_code_location)
        : test_suite_base_name(a_test_suite_base_name),
          test_base_name(a_test_base_name),
          test_meta_factory(a_test_meta_factory),
          code_location(a_code_location) {}